

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O2

void __thiscall pm::Rectangle::Rectangle(Rectangle *this,Vector3 *point,Vector3 *a,Vector3 *b)

{
  Vector3 local_34;
  
  cross(a,b);
  Rectangle(this,point,a,b,&local_34);
  updateDimensions(this);
  return;
}

Assistant:

Rectangle::Rectangle(const Vector3 &point, const Vector3 &a, const Vector3 &b)
    : Rectangle(point, a, b, cross(a, b))
{
	updateDimensions();
}